

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int partOfMountPoint(DirHandle *h,char *fname)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  size_t mntpntlen;
  size_t len;
  int rc;
  char *fname_local;
  DirHandle *h_local;
  
  if (h->mountPoint == (char *)0x0) {
    h_local._4_4_ = 0;
  }
  else if (*fname == '\0') {
    h_local._4_4_ = 1;
  }
  else {
    __n = strlen(fname);
    sVar2 = strlen(h->mountPoint);
    if (sVar2 < __n) {
      h_local._4_4_ = 0;
    }
    else if (__n + 1 == sVar2) {
      h_local._4_4_ = 0;
    }
    else {
      iVar1 = strncmp(fname,h->mountPoint,__n);
      if (iVar1 == 0) {
        h_local._4_4_ = (uint)(h->mountPoint[__n] == '/');
      }
      else {
        h_local._4_4_ = 0;
      }
    }
  }
  return h_local._4_4_;
}

Assistant:

static int partOfMountPoint(DirHandle *h, char *fname)
{
    int rc;
    size_t len, mntpntlen;

    if (h->mountPoint == NULL)
        return 0;
    else if (*fname == '\0')
        return 1;

    len = strlen(fname);
    mntpntlen = strlen(h->mountPoint);
    if (len > mntpntlen)  /* can't be a subset of mountpoint. */
        return 0;

    /* if true, must be not a match or a complete match, but not a subset. */
    if ((len + 1) == mntpntlen)
        return 0;

    rc = strncmp(fname, h->mountPoint, len); /* !!! FIXME: case insensitive? */
    if (rc != 0)
        return 0;  /* not a match. */

    /* make sure /a/b matches /a/b/ and not /a/bc ... */
    return h->mountPoint[len] == '/';
}